

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

Pointer<Attributes> __thiscall
anurbs::Ref<anurbs::BrepFace>::attributes(Ref<anurbs::BrepFace> *this)

{
  __shared_ptr_access<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  shared_ptr<anurbs::Attributes> sVar1;
  Pointer<Attributes> PVar2;
  Ref<anurbs::BrepFace> *this_local;
  
  std::
  __shared_ptr_access<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_RSI);
  sVar1 = Entry<anurbs::BrepFace>::attributes((Entry<anurbs::BrepFace> *)this);
  PVar2.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  PVar2.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Pointer<Attributes>)
         PVar2.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<Attributes> attributes() const
    {
        return m_entry->attributes();
    }